

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall Graph<Node>::royFloyd(Graph<Node> *this)

{
  int *piVar1;
  vector<int> *pvVar2;
  vector<int> *pvVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  int *piVar7;
  size_t __size;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar8;
  vector<int> *pvVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  vector<vector<int>_> *this_00;
  long lVar17;
  long lVar18;
  long lVar19;
  vector<vector<vector<int>_>_> dp;
  vector<vector<vector<int>_>_> local_40;
  
  vector<vector<vector<int>_>_>::vector(&local_40);
  local_40._size = this->_nodeCnt;
  uVar6 = 1;
  do {
    pvVar13 = (void *)(ulong)uVar6;
    bVar5 = (int)uVar6 < local_40._size;
    uVar6 = uVar6 * 2;
  } while (bVar5);
  vector<vector<vector<int>_>_>::realloc(&local_40,pvVar13,__size);
  uVar16 = (ulong)(uint)this->_nodeCnt;
  if (0 < this->_nodeCnt) {
    lVar18 = 0;
    sVar8 = extraout_RDX;
    do {
      uVar6 = 1;
      do {
        pvVar13 = (void *)(ulong)uVar6;
        bVar5 = (int)uVar6 < (int)uVar16;
        uVar6 = uVar6 * 2;
      } while (bVar5);
      this_00 = local_40.vect + lVar18;
      vector<vector<int>_>::realloc(this_00,pvVar13,sVar8);
      this_00->_size = (int)uVar16;
      uVar16 = (ulong)(uint)this->_nodeCnt;
      sVar8 = extraout_RDX_00;
      if (0 < this->_nodeCnt) {
        lVar12 = 0;
        do {
          pvVar9 = local_40.vect[lVar18].vect;
          uVar6 = 1;
          do {
            pvVar13 = (void *)(ulong)uVar6;
            bVar5 = (int)uVar6 < (int)uVar16;
            uVar6 = uVar6 * 2;
          } while (bVar5);
          vector<int>::realloc(pvVar9 + lVar12,pvVar13,sVar8);
          pvVar9[lVar12]._size = (int)uVar16;
          lVar12 = lVar12 + 1;
          uVar16 = (ulong)this->_nodeCnt;
          sVar8 = extraout_RDX_01;
        } while (lVar12 < (long)uVar16);
      }
      lVar18 = lVar18 + 1;
      uVar16 = (ulong)this->_nodeCnt;
    } while (lVar18 < (long)uVar16);
  }
  if (0 < this->_nodeCnt) {
    lVar18 = 0;
    do {
      if (0 < this->_nodeCnt) {
        pvVar9 = local_40.vect[lVar18].vect;
        lVar12 = 0;
        do {
          iVar14 = 0x3f3f3f3f;
          if (lVar18 == lVar12) {
            iVar14 = 0;
          }
          *pvVar9->vect = iVar14;
          lVar12 = lVar12 + 1;
          pvVar9 = pvVar9 + 1;
        } while (lVar12 < this->_nodeCnt);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->_nodeCnt);
  }
  if (0 < (this->edges)._size) {
    pvVar9 = (this->nextNodeInPath).vect;
    piVar7 = &((this->edges).vect)->_cost;
    lVar18 = 0;
    do {
      iVar14 = ((Edge *)(piVar7 + -2))->_nodeS;
      iVar11 = piVar7[-1];
      iVar15 = *piVar7;
      piVar1 = local_40.vect[iVar14].vect[iVar11].vect;
      iVar10 = *piVar1;
      if (iVar15 <= iVar10) {
        iVar10 = iVar15;
      }
      *piVar1 = iVar10;
      piVar1 = local_40.vect[iVar11].vect[iVar14].vect;
      iVar10 = *piVar1;
      if (iVar10 < iVar15) {
        iVar15 = iVar10;
      }
      *piVar1 = iVar15;
      pvVar9[iVar14].vect[iVar11] = iVar11;
      pvVar9[iVar11].vect[iVar14] = iVar14;
      lVar18 = lVar18 + 1;
      piVar7 = piVar7 + 3;
    } while (lVar18 < (this->edges)._size);
  }
  if (0 < this->_nodeCnt) {
    lVar18 = 1;
    do {
      if (0 < this->_nodeCnt) {
        lVar12 = 0;
        do {
          if (0 < this->_nodeCnt) {
            pvVar9 = local_40.vect[lVar12].vect;
            piVar7 = pvVar9[lVar18 + -1].vect;
            pvVar2 = local_40.vect[lVar18 + -1].vect;
            pvVar3 = (this->nextNodeInPath).vect;
            lVar17 = 0;
            lVar19 = 0;
            do {
              iVar11 = *(int *)(*(long *)((long)&pvVar2->vect + lVar17 * 4) + -4 + lVar18 * 4) +
                       piVar7[lVar18 + -1];
              lVar4 = *(long *)((long)&pvVar9->vect + lVar17 * 4);
              iVar14 = *(int *)(lVar4 + -4 + lVar18 * 4);
              if (iVar11 < iVar14) {
                *(int *)(lVar4 + lVar18 * 4) = iVar11;
                piVar1 = pvVar3[lVar12].vect;
                *(int *)((long)piVar1 + lVar17) = piVar1[lVar18 + -1];
              }
              else {
                *(int *)(lVar4 + lVar18 * 4) = iVar14;
              }
              lVar19 = lVar19 + 1;
              lVar17 = lVar17 + 4;
            } while (lVar19 < this->_nodeCnt);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < this->_nodeCnt);
      }
      bVar5 = lVar18 < this->_nodeCnt;
      lVar18 = lVar18 + 1;
    } while (bVar5);
  }
  if (0 < this->_nodeCnt) {
    lVar18 = 0;
    do {
      uVar16 = (ulong)(uint)this->_nodeCnt;
      if (0 < this->_nodeCnt) {
        pvVar9 = local_40.vect[lVar18].vect;
        piVar7 = (this->minDist).vect[lVar18].vect;
        lVar12 = 0;
        do {
          iVar14 = pvVar9->vect[(int)uVar16];
          if (iVar14 == 0x3f3f3f3f) {
            iVar14 = -1;
          }
          piVar7[lVar12] = iVar14;
          lVar12 = lVar12 + 1;
          uVar16 = (ulong)this->_nodeCnt;
          pvVar9 = pvVar9 + 1;
        } while (lVar12 < (long)uVar16);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->_nodeCnt);
  }
  vector<vector<vector<int>_>_>::~vector(&local_40);
  return;
}

Assistant:

void royFloyd() {
        const int Inf = 0x3f3f3f3f;

        //make dp
        vector<vector<vector<int>>> dp;
        dp.resize(_nodeCnt);
        for (int i = 0; i < _nodeCnt; ++i) {
            dp[i].resize(_nodeCnt);
            for (int j = 0; j < _nodeCnt; ++j) {
                dp[i][j].resize(_nodeCnt);
            }
        }

        //initialize dp
        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (i == j) {
                    dp[i][j][0] = 0;
                }
                else {
                    dp[i][j][0] = Inf;
                }
            }
        }

        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();
            int cost = currEdge.getCost();

            dp[source][dest][0] = min(dp[source][dest][0], cost);
            dp[dest][source][0] = min(dp[dest][source][0], cost);

            nextNodeInPath[source][dest] = dest;
            nextNodeInPath[dest][source] = source;
        }

        //calc dp (nodes added from 0 to k - 1 (+1) ||| 0 means no nodes added)
        for (int k = 1; k <= _nodeCnt; ++k) {
            for (int i = 0; i < _nodeCnt; ++i) {
                for (int j = 0; j < _nodeCnt; ++j) {
                    int kAdded = dp[i][k - 1][k - 1] + dp[k - 1][j][k - 1];
                    int kNotAdded = dp[i][j][k - 1];
                    if (kAdded < kNotAdded) {
                        dp[i][j][k] = kAdded;
                        nextNodeInPath[i][j] = nextNodeInPath[i][k - 1];
                    }
                    else {
                        dp[i][j][k] = kNotAdded;
                    }
                }
            }
        }

        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                if (dp[i][j][_nodeCnt] == Inf) {
                    minDist[i][j] = -1;
                }
                else {
                    minDist[i][j] = dp[i][j][_nodeCnt];
                }
            }
        }
    }